

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O0

void vfll32(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,uintptr_t retaddr)

{
  uint32_t a_00;
  float64 data;
  uint64_t ret;
  float32 a;
  int i;
  S390Vector tmp;
  uint8_t vec_exc;
  uintptr_t uStack_30;
  uint8_t vxc;
  uintptr_t retaddr_local;
  CPUS390XState_conflict *pCStack_20;
  _Bool s_local;
  CPUS390XState_conflict *env_local;
  S390Vector *v2_local;
  S390Vector *v1_local;
  
  tmp.byte[0xe] = '\0';
  uStack_30 = retaddr;
  retaddr_local._7_1_ = s;
  pCStack_20 = env;
  env_local = (CPUS390XState_conflict *)v2;
  v2_local = v1;
  memset(&a,0,0x10);
  for (ret._4_4_ = 0; ret._4_4_ < 2; ret._4_4_ = ret._4_4_ + 1) {
    a_00 = s390_vec_read_element32((S390Vector *)env_local,(uint8_t)(ret._4_4_ << 1));
    data = float32_to_float64_s390x(a_00,&pCStack_20->fpu_status);
    s390_vec_write_element64((S390Vector *)&a,(uint8_t)ret._4_4_,data);
    tmp.byte[0xf] = check_ieee_exc(pCStack_20,(uint8_t)(ret._4_4_ << 1),false,tmp.byte + 0xe);
    if (((retaddr_local._7_1_ & 1) != 0) || (tmp.byte[0xf] != '\0')) break;
  }
  handle_ieee_exc(pCStack_20,tmp.byte[0xf],tmp.byte[0xe],uStack_30);
  v2_local->doubleword[0] = _a;
  v2_local->doubleword[1] = tmp.doubleword[0];
  return;
}

Assistant:

static void vfll32(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i;

    for (i = 0; i < 2; i++) {
        /* load from even element */
        const float32 a = s390_vec_read_element32(v2, i * 2);
        const uint64_t ret = float32_to_float64(a, &env->fpu_status);

        s390_vec_write_element64(&tmp, i, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i * 2, false, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}